

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v8::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  byte *pbVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint64_t divisor;
  result rVar5;
  round_direction rVar6;
  int iVar7;
  detail *pdVar8;
  decimal_fp<float> dVar9;
  format_error *this;
  byte bVar10;
  undefined1 is_predecessor_closer;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  buffer<char> *pbVar15;
  ulong uVar16;
  char cVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  uint64_t *puVar21;
  uint64_t error;
  size_t sVar22;
  ulong uVar23;
  bool bVar24;
  undefined4 uVar25;
  float fVar26;
  undefined4 uVar27;
  fp value_00;
  decimal_fp<double> dVar28;
  gen_digits_handler handler;
  unsigned_long u;
  undefined4 in_stack_ffffffffffffff58;
  gen_digits_handler local_98;
  double local_80;
  buffer<char> *local_78;
  uint local_6c;
  uint64_t local_68;
  ulong local_60;
  ulong local_58;
  detail *local_50;
  double local_48;
  detail *local_40;
  ulong local_38;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
                ,0x929,"value is negative");
  }
  local_60 = (ulong)specs & 0xff00000000;
  local_98.fixed = local_60 == 0x200000000;
  if (value <= 0.0) {
    if (0 < precision && local_60 == 0x200000000) {
      uVar23 = (ulong)(uint)precision;
      uVar16 = buf->capacity_;
      if (uVar16 < uVar23) {
        (**buf->_vptr_buffer)(buf,uVar23);
        uVar16 = buf->capacity_;
      }
      if (uVar23 <= uVar16) {
        uVar16 = uVar23;
      }
      buf->size_ = uVar16;
      memset(buf->ptr_,0x30,uVar23);
      return -precision;
    }
    sVar22 = buf->size_;
    uVar16 = sVar22 + 1;
    if (buf->capacity_ < uVar16) {
      (**buf->_vptr_buffer)(buf);
      sVar22 = buf->size_;
      uVar16 = sVar22 + 1;
    }
    buf->size_ = uVar16;
    buf->ptr_[sVar22] = '0';
    return 0;
  }
  uVar11 = specs._4_4_;
  if ((uVar11 >> 0x13 & 1) != 0) {
    iVar19 = snprintf_float<double>(value,precision,specs,buf);
    return iVar19;
  }
  if (precision < 0) {
    if ((uVar11 >> 0x12 & 1) == 0) {
      dVar28 = dragonbox::to_decimal<double>(value);
      write<char,_fmt::v8::appender,_unsigned_long,_0>((appender)buf,dVar28.significand);
      return dVar28.exponent;
    }
    dVar9 = dragonbox::to_decimal<float>((float)value);
    write<char,_fmt::v8::appender,_unsigned_int,_0>((appender)buf,dVar9.significand);
    return dVar9.exponent;
  }
  local_50 = (detail *)((ulong)value & 0xfffffffffffff);
  pdVar8 = (detail *)((ulong)local_50 | 0x10000000000000);
  bVar24 = (ulong)value >> 0x34 == 0;
  local_40 = pdVar8;
  if (bVar24) {
    local_40 = local_50;
  }
  uVar18 = (uint)((ulong)value >> 0x34) - 0x433;
  local_6c = uVar18;
  if (bVar24) {
    lVar2 = 0x3f;
    if (local_50 != (detail *)0x0) {
      for (; (ulong)local_50 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    pdVar8 = (detail *)((long)local_50 << (~(byte)lVar2 + 0x35 & 0x3f));
    uVar18 = ((uint)lVar2 ^ 0xffffffc0) - 0x426;
    local_6c = 0xfffffbce;
  }
  iVar19 = (int)((ulong)((long)(int)(-0x32 - uVar18) * 0x4d104d42 + 0xffffffff) >> 0x20);
  uVar12 = iVar19 + 0x15b;
  uVar13 = iVar19 + 0x162;
  if (-1 < (int)uVar12) {
    uVar13 = uVar12;
  }
  local_38 = (ulong)(uVar13 & 0xfffffff8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)pdVar8 << 0xb;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = basic_impl_data<void>::pow10_significands[(long)((int)uVar13 >> 3) + 1];
  uVar23 = SUB168(auVar3 * auVar4,8) - (SUB168(auVar3 * auVar4,0) >> 0x3f);
  bVar10 = -((char)basic_impl_data<void>::pow10_exponents[(long)((int)uVar13 >> 3) + 1] +
            (char)uVar18) - 0x35;
  pbVar1 = (byte *)buf->ptr_;
  local_98.size = 0;
  local_98.exp10 = 0x154 - (uVar13 & 0xfffffff8);
  local_68 = 1L << (bVar10 & 0x3f);
  uVar16 = uVar23 >> (bVar10 & 0x3f);
  local_98.buf = (char *)pbVar1;
  local_98.precision = precision;
  local_48 = value;
  if ((uint)uVar16 == 0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
                ,0x2ba,"");
  }
  local_78 = buf;
  if (uVar16 >> 0x20 != 0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
                ,699,"");
  }
  uVar13 = (uint)uVar16 | 1;
  uVar18 = 0x1f;
  if (uVar13 != 0) {
    for (; uVar13 >> uVar18 == 0; uVar18 = uVar18 - 1) {
    }
  }
  uVar14 = uVar16 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar18 * 8);
  uVar20 = uVar14 >> 0x20;
  iVar19 = (int)(uVar14 >> 0x20);
  local_80 = value;
  if (local_60 == 0x200000000) {
    uVar18 = local_98.exp10 + iVar19;
    if ((uVar18 ^ 0x7fffffff) < (uint)precision && 0 < (int)uVar18) {
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this,"number is too big");
      __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
    }
    local_98.precision = uVar18 + precision;
    if (local_98.precision != 0 && SCARRY4(uVar18,precision) == local_98.precision < 0)
    goto LAB_00110a1e;
    if (local_98.precision < 0) {
      iVar19 = iVar19 + local_98.exp10;
      uVar16 = 0;
      goto LAB_00110dff;
    }
    rVar6 = get_round_direction(basic_impl_data<void>::power_of_10_64
                                [(long)(uVar14 - 0x100000000) >> 0x20] << (bVar10 & 0x3f),
                                uVar23 / 10,10);
    if (rVar6 != unknown) {
      local_98.size = 1;
      *pbVar1 = rVar6 == up | 0x30;
      goto LAB_00110ded;
    }
    uVar25 = SUB84(local_80,0);
    uVar27 = (undefined4)((ulong)local_80 >> 0x20);
    iVar7 = 0;
    uVar18 = 0;
  }
  else {
LAB_00110a1e:
    local_58 = local_68 - 1;
    uVar23 = uVar23 & local_58;
    puVar21 = basic_impl_data<void>::power_of_10_64 + (iVar19 - 1);
    do {
      uVar18 = (uint)uVar20;
      switch(uVar18 - 1) {
      case 0:
        cVar17 = (char)uVar16;
        uVar16 = 0;
        goto LAB_00110b30;
      case 1:
        cVar17 = (char)((uVar16 & 0xffffffff) / 10);
        iVar19 = (int)((uVar16 & 0xffffffff) / 10) * 10;
        break;
      case 2:
        cVar17 = (char)((uVar16 & 0xffffffff) / 100);
        iVar19 = (int)((uVar16 & 0xffffffff) / 100) * 100;
        break;
      case 3:
        cVar17 = (char)((uVar16 & 0xffffffff) / 1000);
        iVar19 = (int)((uVar16 & 0xffffffff) / 1000) * 1000;
        break;
      case 4:
        cVar17 = (char)((uVar16 & 0xffffffff) / 10000);
        iVar19 = (int)((uVar16 & 0xffffffff) / 10000) * 10000;
        break;
      case 5:
        uVar14 = uVar16 >> 5 & 0x7ffffff;
        cVar17 = (char)(uVar14 / 0xc35);
        iVar19 = (int)(uVar14 / 0xc35) * 100000;
        break;
      case 6:
        cVar17 = (char)((uVar16 & 0xffffffff) / 1000000);
        iVar19 = (int)((uVar16 & 0xffffffff) / 1000000) * 1000000;
        break;
      case 7:
        cVar17 = (char)((uVar16 & 0xffffffff) / 10000000);
        iVar19 = (int)((uVar16 & 0xffffffff) / 10000000) * 10000000;
        break;
      case 8:
        cVar17 = (char)((uVar16 & 0xffffffff) / 100000000);
        iVar19 = (int)((uVar16 & 0xffffffff) / 100000000) * 100000000;
        break;
      case 9:
        uVar14 = (uVar16 >> 9 & 0x7fffff) * 0x44b83;
        cVar17 = (char)(uVar14 >> 0x27);
        iVar19 = (uint)(uVar14 >> 0x27) * 1000000000;
        break;
      default:
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
                    ,0x2ff,"invalid number of digits");
      }
      uVar16 = (ulong)(uint)((int)uVar16 - iVar19);
LAB_00110b30:
      rVar5 = gen_digits_handler::on_digit
                        (&local_98,cVar17 + '0',*puVar21 << (bVar10 & 0x3f),
                         (uVar16 << (bVar10 & 0x3f)) + uVar23,1,true);
      divisor = local_68;
      if (rVar5 != more) {
        iVar19 = uVar18 - 1;
        goto LAB_00110c96;
      }
      puVar21 = puVar21 + -1;
      uVar20 = (ulong)(uVar18 - 1);
    } while (1 < uVar18);
    error = 1;
    iVar19 = 0;
    do {
      uVar16 = uVar23 * 10;
      error = error * 10;
      uVar23 = uVar16 & local_58;
      iVar19 = iVar19 + -1;
      rVar5 = gen_digits_handler::on_digit
                        (&local_98,(char)(uVar16 >> (bVar10 & 0x3f)) + '0',divisor,uVar23,error,
                         false);
    } while (rVar5 == more);
LAB_00110c96:
    uVar25 = SUB84(local_80,0);
    uVar27 = (undefined4)((ulong)local_80 >> 0x20);
    iVar7 = local_98.precision;
    uVar18 = local_98.size;
    if (rVar5 != error) {
LAB_00110ded:
      uVar16 = (ulong)(uint)local_98.size;
      iVar19 = iVar19 + local_98.exp10;
      if (local_98.size < 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                    ,0x195,"negative value");
      }
LAB_00110dff:
      pbVar15 = local_78;
      uVar23 = local_78->capacity_;
      if (uVar23 < uVar16) {
        (**local_78->_vptr_buffer)(local_78,uVar16);
        uVar23 = pbVar15->capacity_;
      }
      if (uVar23 < uVar16) {
        uVar16 = uVar23;
      }
      pbVar15->size_ = uVar16;
      goto LAB_00110e2a;
    }
  }
  pbVar15 = local_78;
  iVar19 = (uVar18 - ((int)local_38 + 8)) + iVar19 + 0x15b;
  if ((uVar11 >> 0x12 & 1) == 0) {
    local_48 = (double)((ulong)local_48 >> 0x35);
    bVar24 = local_48 != 0.0 && local_50 == (detail *)0x0;
    uVar16 = (ulong)local_6c;
    pdVar8 = local_40;
  }
  else {
    fVar26 = (float)(double)CONCAT44(uVar27,uVar25);
    uVar18 = (uint)fVar26 & 0x7fffff;
    pdVar8 = (detail *)(ulong)uVar18 + 0x800000;
    if ((uint)fVar26 < 0x800000) {
      pdVar8 = (detail *)(ulong)uVar18;
    }
    uVar16 = 0xffffff6b;
    if ((uint)fVar26 >= 0x800000) {
      uVar16 = (ulong)(((uint)fVar26 >> 0x17) - 0x96);
    }
    bVar24 = 0xffffff < (uint)fVar26 && uVar18 == 0;
  }
  is_predecessor_closer = 0xff;
  if (iVar7 < 0x2ff) {
    is_predecessor_closer = (undefined1)iVar7;
  }
  value_00.e._0_1_ = bVar24;
  value_00.f = uVar16;
  value_00._9_7_ = 0;
  format_dragon(pdVar8,value_00,(bool)is_predecessor_closer,(int)local_78,
                (buffer<char> *)&stack0xffffffffffffff5c,
                (int *)CONCAT44(iVar19,in_stack_ffffffffffffff58));
LAB_00110e2a:
  if ((uVar11 >> 0x14 & 1) == 0 && local_60 != 0x200000000) {
    sVar22 = pbVar15->size_;
    if (sVar22 != 0) {
      do {
        iVar7 = iVar19 + 1;
        if (pbVar15->ptr_[sVar22 - 1] != '0') {
          uVar16 = pbVar15->capacity_;
          if (uVar16 < sVar22) {
            (**pbVar15->_vptr_buffer)(pbVar15,sVar22);
            uVar16 = pbVar15->capacity_;
          }
          goto LAB_00110e79;
        }
        sVar22 = sVar22 - 1;
        iVar19 = iVar7;
      } while (sVar22 != 0);
    }
    uVar16 = pbVar15->capacity_;
    sVar22 = 0;
LAB_00110e79:
    if (uVar16 < sVar22) {
      sVar22 = uVar16;
    }
    pbVar15->size_ = sVar22;
  }
  return iVar19;
}

Assistant:

FMT_HEADER_ONLY_CONSTEXPR20 int format_float(Float value, int precision,
                                             float_specs specs,
                                             buffer<char>& buf) {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (specs.fallback) return snprintf_float(value, precision, specs, buf);

  if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  int exp = 0;
  bool use_dragon = true;
  if (is_fast_float<Float>()) {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = fp();
    bool is_predecessor_closer =
        specs.binary32 ? f.assign(static_cast<float>(value)) : f.assign(value);
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, is_predecessor_closer, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}